

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void sat_solver2_delete(sat_solver2 *s)

{
  int **__ptr;
  Vec_Set_t *__ptr_00;
  word *__ptr_01;
  Prf_Man_t *__ptr_02;
  Vec_Int_t *__ptr_03;
  Vec_Wrd_t *__ptr_04;
  veci *__ptr_05;
  int i;
  long lVar1;
  int i_1;
  long lVar2;
  
  veci_delete(&s->order);
  veci_delete(&s->trail_lim);
  veci_delete(&s->tagged);
  veci_delete(&s->stack);
  veci_delete(&s->temp_clause);
  veci_delete(&s->temp_proof);
  veci_delete(&s->conf_final);
  veci_delete(&s->mark_levels);
  veci_delete(&s->min_lit_order);
  veci_delete(&s->min_step_order);
  veci_delete(&s->act_clas);
  veci_delete(&s->claProofs);
  for (lVar1 = 0; __ptr = (s->Mem).pPages, lVar1 < (s->Mem).nPagesAlloc; lVar1 = lVar1 + 1) {
    if (__ptr[lVar1] != (int *)0x0) {
      free(__ptr[lVar1]);
      (s->Mem).pPages[lVar1] = (int *)0x0;
    }
  }
  if (__ptr != (int **)0x0) {
    free(__ptr);
    (s->Mem).pPages = (int **)0x0;
  }
  __ptr_00 = s->pPrf1;
  if (__ptr_00 != (Vec_Set_t *)0x0) {
    for (lVar1 = 0; lVar1 < __ptr_00->nPagesAlloc; lVar1 = lVar1 + 1) {
      __ptr_01 = __ptr_00->pPages[lVar1];
      if (__ptr_01 != (word *)0x0) {
        free(__ptr_01);
        __ptr_00->pPages[lVar1] = (word *)0x0;
      }
    }
    free(__ptr_00->pPages);
    free(__ptr_00);
  }
  __ptr_02 = s->pPrf2;
  if (__ptr_02 != (Prf_Man_t *)0x0) {
    __ptr_03 = __ptr_02->vSaved;
    free(__ptr_03->pArray);
    free(__ptr_03);
    __ptr_04 = __ptr_02->vInfo;
    free(__ptr_04->pArray);
    free(__ptr_04);
    free(__ptr_02);
  }
  Int2_ManStop(s->pInt2);
  if (s->vi != (varinfo2 *)0x0) {
    if (s->wlists != (veci *)0x0) {
      lVar1 = 0;
      for (lVar2 = 0; __ptr_05 = s->wlists,
          SBORROW8(lVar2,(long)s->cap * 2) != lVar2 + (long)s->cap * -2 < 0; lVar2 = lVar2 + 1) {
        veci_delete((veci *)((long)&__ptr_05->cap + lVar1));
        lVar1 = lVar1 + 0x10;
      }
      if (__ptr_05 != (veci *)0x0) {
        free(__ptr_05);
        s->wlists = (veci *)0x0;
      }
    }
    if (s->vi != (varinfo2 *)0x0) {
      free(s->vi);
      s->vi = (varinfo2 *)0x0;
    }
    if (s->levels != (int *)0x0) {
      free(s->levels);
      s->levels = (int *)0x0;
    }
    if (s->assigns != (char *)0x0) {
      free(s->assigns);
      s->assigns = (char *)0x0;
    }
    if (s->trail != (lit *)0x0) {
      free(s->trail);
      s->trail = (lit *)0x0;
    }
    if (s->orderpos != (int *)0x0) {
      free(s->orderpos);
      s->orderpos = (int *)0x0;
    }
    if (s->reasons != (cla *)0x0) {
      free(s->reasons);
      s->reasons = (cla *)0x0;
    }
    if (s->units != (cla *)0x0) {
      free(s->units);
      s->units = (cla *)0x0;
    }
    if (s->activity != (uint *)0x0) {
      free(s->activity);
      s->activity = (uint *)0x0;
    }
    if (s->activity2 != (uint *)0x0) {
      free(s->activity2);
      s->activity2 = (uint *)0x0;
    }
    free(s->model);
  }
  free(s);
  return;
}

Assistant:

void sat_solver2_delete(sat_solver2* s)
{
    int fVerify = 0;
    if ( fVerify )
    {
        veci * pCore = (veci *)Sat_ProofCore( s );
//        Abc_Print(1, "UNSAT core contains %d clauses (%6.2f %%).\n", veci_size(pCore), 100.0*veci_size(pCore)/veci_size(&s->clauses) );
        veci_delete( pCore );
        ABC_FREE( pCore );
//        if ( s->fProofLogging )
//            Sat_ProofCheck( s );
    }

    // report statistics
//    Abc_Print(1, "Used %6.2f MB for proof-logging.   Unit clauses = %d.\n", 1.0 * Vec_ReportMemory(&s->Proofs) / (1<<20), s->nUnits );

    // delete vectors
    veci_delete(&s->order);
    veci_delete(&s->trail_lim);
    veci_delete(&s->tagged);
    veci_delete(&s->stack);
    veci_delete(&s->temp_clause);
    veci_delete(&s->temp_proof);
    veci_delete(&s->conf_final);
    veci_delete(&s->mark_levels);
    veci_delete(&s->min_lit_order);
    veci_delete(&s->min_step_order);
//    veci_delete(&s->learnt_live);
    veci_delete(&s->act_clas);
    veci_delete(&s->claProofs);
//    veci_delete(&s->clauses);
//    veci_delete(&s->lrns);
    Sat_MemFree_( &s->Mem );
//    veci_delete(&s->proofs);
    Vec_SetFree( s->pPrf1 );
    Prf_ManStop( s->pPrf2 );
    Int2_ManStop( s->pInt2 );

    // delete arrays
    if (s->vi != 0){
        int i;
        if ( s->wlists )
            for (i = 0; i < s->cap*2; i++)
                veci_delete(&s->wlists[i]);
        ABC_FREE(s->wlists   );
        ABC_FREE(s->vi       );
        ABC_FREE(s->levels   );
        ABC_FREE(s->assigns  );
        ABC_FREE(s->trail    );
        ABC_FREE(s->orderpos );
        ABC_FREE(s->reasons  );
        ABC_FREE(s->units    );
        ABC_FREE(s->activity );
        ABC_FREE(s->activity2);
        ABC_FREE(s->model    );
    }
    ABC_FREE(s);

//    Abc_PrintTime( 1, "Time", Time );
}